

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::reportRebuild(HEkkDual *this,HighsInt reason_for_rebuild)

{
  string sStack_38;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x25,0);
  iterationAnalysisData(this);
  this->analysis->rebuild_reason = reason_for_rebuild;
  HEkk::rebuildReason_abi_cxx11_(&sStack_38,this->ekk_instance_,reason_for_rebuild);
  std::__cxx11::string::operator=
            ((string *)&this->analysis->rebuild_reason_string,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if ((this->ekk_instance_->options_->super_HighsOptionsStruct).output_flag == true) {
    HighsSimplexAnalysis::invertReport(this->analysis);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x25,0);
  return;
}

Assistant:

void HEkkDual::reportRebuild(const HighsInt reason_for_rebuild) {
  analysis->simplexTimerStart(ReportRebuildClock);
  iterationAnalysisData();
  analysis->rebuild_reason = reason_for_rebuild;
  analysis->rebuild_reason_string =
      ekk_instance_.rebuildReason(reason_for_rebuild);
  if (ekk_instance_.options_->output_flag) analysis->invertReport();
  analysis->simplexTimerStop(ReportRebuildClock);
}